

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O3

void __thiscall
Validator_importSecondGenComponentWithInvalidUri_Test::
~Validator_importSecondGenComponentWithInvalidUri_Test
          (Validator_importSecondGenComponentWithInvalidUri_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Validator, importSecondGenComponentWithInvalidUri)
{
    const std::string errorMessageImporter =
        "The attempt to resolve imports with the model at '" + resourcePath("importer/") + "i am broken and invalid.cellml' failed: the file could not be opened.";
    const std::string errorMessageValidator =
        "Imported component 'c' is not valid because:\n"
        "  -> Component 'c' importing 'c' from 'invalid_import_url.cellml' has an error:\n"
        "   - Import of component 'c' has an invalid URI in the xlink:href attribute.";

    auto parser = libcellml::Parser::create();
    auto validator = libcellml::Validator::create();
    auto importer = libcellml::Importer::create();

    auto model = parser->parseModel(fileContents("importer/import_invalid_import_url.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    validator->validateModel(model);
    EXPECT_EQ(size_t(0), validator->issueCount());

    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_EQ(size_t(1), importer->issueCount());
    EXPECT_EQ(errorMessageImporter, importer->issue(0)->description());
    EXPECT_EQ(model->component("c", true), importer->issue(0)->item()->component());

    validator->validateModel(model);
    EXPECT_EQ(size_t(1), validator->issueCount());
    EXPECT_EQ(errorMessageValidator, validator->issue(0)->description());
}